

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_make_context(sexp ctx,size_t size,size_t max_size)

{
  sexp in_RDI;
  sexp unaff_retaddr;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp_uint_t in_stack_00006090;
  sexp_uint_t in_stack_00006098;
  sexp_uint_t in_stack_ffffffffffffffc0;
  sexp_proc1 p_Var1;
  sexp in_stack_ffffffffffffffd0;
  sexp local_28 [3];
  sexp local_10;
  sexp local_8;
  
  local_28[0] = (sexp)0x43e;
  local_10 = in_RDI;
  memset(&stack0xffffffffffffffc8,0,0x10);
  if (local_10 == (sexp)0x0) {
    local_28[0] = sexp_bootstrap_context(in_stack_00006098,in_stack_00006090);
    if (local_28[0] == (sexp)0x0) {
      return (sexp)0x0;
    }
    if ((((ulong)local_28[0] & 3) == 0) && (local_28[0]->tag == 0x13)) {
      return local_28[0];
    }
  }
  else {
    in_stack_ffffffffffffffd0 = (sexp)(local_10->value).context.saves;
    (local_10->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffc8;
    local_28[0] = sexp_alloc_tagged_aux
                            (in_stack_ffffffffffffffd0,(size_t)local_28,in_stack_ffffffffffffffc0);
    (local_28[0]->value).type.finalize = (local_10->value).type.finalize;
  }
  if ((local_28[0] == (sexp)0x0) || ((((ulong)local_28[0] & 3) == 0 && (local_28[0]->tag == 0x13))))
  {
    local_8 = local_28[0];
  }
  else {
    (local_28[0]->value).type.slots = local_10;
    (local_28[0]->value).port.size = 0x3e;
    (local_28[0]->value).port.flags = 0x3e;
    (local_28[0]->value).context.mark_stack_ptr = (sexp_mark_stack_ptr_t *)0x0;
    (local_28[0]->value).context.saves = (sexp_gc_var_t *)0x0;
    (local_28[0]->value).port.offset = 0x23e;
    (local_28[0]->value).context.last_fp = 0;
    (local_28[0]->value).context.gc_count = 0;
    (local_28[0]->value).context.gc_usecs = 0;
    (local_28[0]->value).flonum_bits[0x60a1] = '\0';
    (local_28[0]->value).flonum_bits[0x60a2] = '\0';
    (local_28[0]->value).flonum_bits[0x60a0] = '\x01';
    (local_28[0]->value).flonum_bits[0x60a4] = '\0';
    (local_28[0]->value).opcode.dl = (sexp)0x3e;
    (local_28[0]->value).context.refuel = 500;
    if (local_10 == (sexp)0x0) {
      p_Var1 = (sexp_proc1)0x3e;
    }
    else {
      p_Var1 = (local_10->value).opcode.func;
    }
    (local_28[0]->value).opcode.func = p_Var1;
    if (local_10 == (sexp)0x0) {
      sexp_init_context_globals(unaff_retaddr);
    }
    else {
      (local_28[0]->value).type.setters = (local_10->value).type.setters;
      (local_28[0]->value).type.id = (local_10->value).type.id;
      (local_10->value).context.saves = (sexp_gc_var_t *)in_stack_ffffffffffffffd0;
    }
    local_8 = local_28[0];
  }
  return local_8;
}

Assistant:

sexp sexp_make_context (sexp ctx, size_t size, size_t max_size) {
  sexp_gc_var1(res);
  if (ctx) sexp_gc_preserve1(ctx, res);
#if ! SEXP_USE_GLOBAL_HEAP
  if (! ctx) {
    res = sexp_bootstrap_context(size, max_size);
    if (!res || sexp_exceptionp(res)) return res;
  } else
#endif
    {
      res = sexp_alloc_type(ctx, context, SEXP_CONTEXT);
#if ! SEXP_USE_BOEHM && ! SEXP_USE_MALLOC
      sexp_context_heap(res) = sexp_context_heap(ctx);
#endif
    }
  if (!res || sexp_exceptionp(res)) return res;
  sexp_context_parent(res) = ctx;
  sexp_context_name(res) = sexp_context_specific(res) = SEXP_FALSE;
  sexp_context_mark_stack_ptr(res) = NULL;
  sexp_context_saves(res) = NULL;
  sexp_context_params(res) = SEXP_NULL;
  sexp_context_last_fp(res) = 0;
#if SEXP_USE_TIME_GC
  sexp_context_gc_count(res) = 0;
  sexp_context_gc_usecs(res) = 0;
#endif
#if SEXP_USE_TRACK_ALLOC_TIMES
  sexp_context_alloc_count(res) = 0;
  sexp_context_alloc_usecs(res) = 0;
  sexp_context_alloc_usecs_sq(res) = 0;
#endif
  sexp_context_tracep(res) = 0;
  sexp_context_timeoutp(res) = 0;
  sexp_context_tailp(res) = 1;
#if SEXP_USE_GREEN_THREADS
  sexp_context_errorp(res) = 0;
  sexp_context_event(res) = SEXP_FALSE;
  sexp_context_refuel(res) = SEXP_DEFAULT_QUANTUM;
#endif
#if SEXP_USE_DL
  sexp_context_dl(res) = ctx ? sexp_context_dl(ctx) : SEXP_FALSE;
#endif
  if (ctx) {
    sexp_context_globals(res) = sexp_context_globals(ctx);
    sexp_context_dk(res) = sexp_context_dk(ctx);
    sexp_gc_release1(ctx);
  } else {
    sexp_init_context_globals(res);
  }
  return res;
}